

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O1

int GetHuffBitLengthsAndCodes(VP8LHistogramSet *histogram_image,HuffmanTreeCode *huffman_codes)

{
  int iVar1;
  uint uVar2;
  VP8LHistogram **ppVVar3;
  VP8LHistogram *pVVar4;
  bool bVar5;
  void *ptr;
  uint8_t *buf_rle;
  HuffmanTree *huff_tree;
  long lVar6;
  ulong uVar7;
  int iVar8;
  size_t size;
  HuffmanTreeCode *pHVar9;
  void *pvVar10;
  void *pvVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  uint64_t nmemb;
  
  iVar1 = histogram_image->size;
  lVar14 = (long)iVar1;
  if (lVar14 < 1) {
    nmemb = 0;
  }
  else {
    ppVVar3 = histogram_image->histograms;
    lVar6 = 0;
    nmemb = 0;
    pHVar9 = huffman_codes;
    do {
      pVVar4 = ppVVar3[lVar6];
      lVar12 = 0;
      do {
        if (lVar12 == 0) {
          iVar8 = pVVar4->palette_code_bits;
          iVar13 = (1 << ((byte)iVar8 & 0x1f)) + 0x118;
          if (iVar8 < 1) {
            iVar13 = 0x118;
          }
        }
        else {
          iVar13 = 0x100;
          if (lVar12 == 0x60) {
            iVar13 = 0x28;
          }
        }
        *(int *)((long)&pHVar9->num_symbols + lVar12) = iVar13;
        nmemb = nmemb + (long)iVar13;
        lVar12 = lVar12 + 0x18;
      } while (lVar12 != 0x78);
      lVar6 = lVar6 + 1;
      pHVar9 = pHVar9 + 5;
    } while (lVar6 != lVar14);
  }
  ptr = WebPSafeCalloc(nmemb,3);
  if (iVar1 < 1 || ptr == (void *)0x0) {
    size = 0;
  }
  else {
    pvVar11 = (void *)((long)ptr + nmemb * 2);
    uVar7 = 1;
    if (1 < iVar1 * 5) {
      uVar7 = (ulong)(uint)(iVar1 * 5);
    }
    lVar6 = 0;
    size = 0;
    pvVar10 = ptr;
    do {
      uVar2 = *(uint *)((long)&huffman_codes->num_symbols + lVar6);
      *(void **)((long)&huffman_codes->codes + lVar6) = pvVar10;
      *(void **)((long)&huffman_codes->code_lengths + lVar6) = pvVar11;
      pvVar10 = (void *)((long)pvVar10 + (long)(int)uVar2 * 2);
      pvVar11 = (void *)((long)pvVar11 + (long)(int)uVar2);
      if ((int)size <= (int)uVar2) {
        size = (size_t)uVar2;
      }
      lVar6 = lVar6 + 0x18;
    } while (uVar7 * 0x18 != lVar6);
  }
  bVar5 = true;
  if (ptr == (void *)0x0) {
    buf_rle = (uint8_t *)0x0;
    huff_tree = (HuffmanTree *)0x0;
  }
  else {
    buf_rle = (uint8_t *)WebPSafeMalloc(1,size);
    huff_tree = (HuffmanTree *)WebPSafeMalloc(size * 3,0x10);
    if (huff_tree != (HuffmanTree *)0x0 && buf_rle != (uint8_t *)0x0) {
      iVar8 = 1;
      if (iVar1 < 1) {
        bVar5 = false;
      }
      else {
        lVar6 = 0;
        pHVar9 = huffman_codes;
        do {
          pVVar4 = histogram_image->histograms[lVar6];
          VP8LCreateHuffmanTree(pVVar4->literal,0xf,buf_rle,huff_tree,pHVar9);
          VP8LCreateHuffmanTree(pVVar4->red,0xf,buf_rle,huff_tree,pHVar9 + 1);
          VP8LCreateHuffmanTree(pVVar4->blue,0xf,buf_rle,huff_tree,pHVar9 + 2);
          VP8LCreateHuffmanTree(pVVar4->alpha,0xf,buf_rle,huff_tree,pHVar9 + 3);
          VP8LCreateHuffmanTree(pVVar4->distance,0xf,buf_rle,huff_tree,pHVar9 + 4);
          lVar6 = lVar6 + 1;
          pHVar9 = pHVar9 + 5;
        } while (lVar14 != lVar6);
        bVar5 = false;
        iVar8 = 1;
      }
      goto LAB_00140c90;
    }
  }
  iVar8 = 0;
LAB_00140c90:
  WebPSafeFree(huff_tree);
  WebPSafeFree(buf_rle);
  if (bVar5) {
    WebPSafeFree(ptr);
    memset(huffman_codes,0,lVar14 * 0x78);
  }
  return iVar8;
}

Assistant:

static int GetHuffBitLengthsAndCodes(
    const VP8LHistogramSet* const histogram_image,
    HuffmanTreeCode* const huffman_codes) {
  int i, k;
  int ok = 0;
  uint64_t total_length_size = 0;
  uint8_t* mem_buf = NULL;
  const int histogram_image_size = histogram_image->size;
  int max_num_symbols = 0;
  uint8_t* buf_rle = NULL;
  HuffmanTree* huff_tree = NULL;

  // Iterate over all histograms and get the aggregate number of codes used.
  for (i = 0; i < histogram_image_size; ++i) {
    const VP8LHistogram* const histo = histogram_image->histograms[i];
    HuffmanTreeCode* const codes = &huffman_codes[5 * i];
    assert(histo != NULL);
    for (k = 0; k < 5; ++k) {
      const int num_symbols =
          (k == 0) ? VP8LHistogramNumCodes(histo->palette_code_bits) :
          (k == 4) ? NUM_DISTANCE_CODES : 256;
      codes[k].num_symbols = num_symbols;
      total_length_size += num_symbols;
    }
  }

  // Allocate and Set Huffman codes.
  {
    uint16_t* codes;
    uint8_t* lengths;
    mem_buf = (uint8_t*)WebPSafeCalloc(total_length_size,
                                       sizeof(*lengths) + sizeof(*codes));
    if (mem_buf == NULL) goto End;

    codes = (uint16_t*)mem_buf;
    lengths = (uint8_t*)&codes[total_length_size];
    for (i = 0; i < 5 * histogram_image_size; ++i) {
      const int bit_length = huffman_codes[i].num_symbols;
      huffman_codes[i].codes = codes;
      huffman_codes[i].code_lengths = lengths;
      codes += bit_length;
      lengths += bit_length;
      if (max_num_symbols < bit_length) {
        max_num_symbols = bit_length;
      }
    }
  }

  buf_rle = (uint8_t*)WebPSafeMalloc(1ULL, max_num_symbols);
  huff_tree = (HuffmanTree*)WebPSafeMalloc(3ULL * max_num_symbols,
                                           sizeof(*huff_tree));
  if (buf_rle == NULL || huff_tree == NULL) goto End;

  // Create Huffman trees.
  for (i = 0; i < histogram_image_size; ++i) {
    HuffmanTreeCode* const codes = &huffman_codes[5 * i];
    VP8LHistogram* const histo = histogram_image->histograms[i];
    VP8LCreateHuffmanTree(histo->literal, 15, buf_rle, huff_tree, codes + 0);
    VP8LCreateHuffmanTree(histo->red, 15, buf_rle, huff_tree, codes + 1);
    VP8LCreateHuffmanTree(histo->blue, 15, buf_rle, huff_tree, codes + 2);
    VP8LCreateHuffmanTree(histo->alpha, 15, buf_rle, huff_tree, codes + 3);
    VP8LCreateHuffmanTree(histo->distance, 15, buf_rle, huff_tree, codes + 4);
  }
  ok = 1;
 End:
  WebPSafeFree(huff_tree);
  WebPSafeFree(buf_rle);
  if (!ok) {
    WebPSafeFree(mem_buf);
    memset(huffman_codes, 0, 5 * histogram_image_size * sizeof(*huffman_codes));
  }
  return ok;
}